

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

Index * __thiscall libDAI::Index::operator=(Index *this,Index *ind)

{
  if (this != ind) {
    this->_index = ind->_index;
    std::vector<int,_std::allocator<int>_>::operator=(&this->_count,&ind->_count);
    std::vector<int,_std::allocator<int>_>::operator=(&this->_max,&ind->_max);
    std::vector<int,_std::allocator<int>_>::operator=(&this->_sum,&ind->_sum);
  }
  return this;
}

Assistant:

Index & operator=(const Index & ind) {
            if(this!=&ind) {
                _index = ind._index;
                _count = ind._count;
                _max = ind._max;
                _sum = ind._sum;
            }
            return *this;
        }